

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  char __c;
  _Setfill<char> _Var1;
  bool bVar2;
  _Setw _Var3;
  reference line_00;
  ostream *poVar4;
  Size SVar5;
  char_type fill;
  value_type *line_local;
  ostream *stream_local;
  
  __c = std::ios::fill();
  _Var1 = std::setfill<char>(' ');
  std::operator<<(stream,_Var1._M_c);
  if ((line->overflow_ == 0) &&
     (bVar2 = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
              ::operator!=(&line->line_,&line->end_), bVar2)) {
    _Var3 = std::setw((int)line->margin_->left_);
    poVar4 = std::operator<<(stream,_Var3);
    poVar4 = std::operator<<(poVar4,"");
    line_00 = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
              ::operator*(&line->line_);
    poVar4 = operator<<(poVar4,line_00);
    _Var3 = std::setw((int)line->margin_->right_);
    poVar4 = std::operator<<(poVar4,_Var3);
    std::operator<<(poVar4,"");
  }
  else {
    SVar5 = Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::size(line->margin_);
    _Var3 = std::setw((int)SVar5.x);
    poVar4 = std::operator<<(stream,_Var3);
    std::operator<<(poVar4,"");
  }
  _Var1 = std::setfill<char>(__c);
  poVar4 = std::operator<<(stream,_Var1._M_c);
  return poVar4;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, margin_line<Block> const& line) {
        auto fill = stream.fill();
        stream << std::setfill(' ');
        if (!line.overflow_ && line.line_ != line.end_) {
            stream << std::setw(line.margin_->left_)
                   << u8""
                   << *line.line_
                   << std::setw(line.margin_->right_)
                   << u8"";
        } else {
            stream << std::setw(line.margin_->size().x)
                   << u8"";
        }

        return stream << std::setfill(fill);
    }